

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::HashAggregateDistinctFinalizeEvent::FinishEvent(HashAggregateDistinctFinalizeEvent *this)

{
  shared_ptr<duckdb::HashAggregateFinalizeEvent,_true> new_event;
  undefined1 local_49;
  shared_ptr<duckdb::HashAggregateFinalizeEvent,_true> local_48;
  shared_ptr<duckdb::Event,_true> local_38;
  element_type *local_28;
  shared_ptr<duckdb::HashAggregateFinalizeEvent> local_20;
  
  local_28 = (this->super_BasePipelineEvent).pipeline.internal.
             super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::HashAggregateFinalizeEvent,std::allocator<duckdb::HashAggregateFinalizeEvent>,duckdb::ClientContext&,duckdb::Pipeline*,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
            (&local_20.
              super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(HashAggregateFinalizeEvent **)&local_20,
             (allocator<duckdb::HashAggregateFinalizeEvent> *)&local_49,this->context,&local_28,
             this->op,this->gstate);
  shared_ptr<duckdb::HashAggregateFinalizeEvent,_true>::shared_ptr(&local_48,&local_20);
  if (local_20.super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_48.internal.
       super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_48.internal.
         super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  local_48.internal.
  super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.internal.
  super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent((Event *)this,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48.internal.
      super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.internal.
               super___shared_ptr<duckdb::HashAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void HashAggregateDistinctFinalizeEvent::FinishEvent() {
	// Now that everything is added to the main ht, we can actually finalize
	auto new_event = make_shared_ptr<HashAggregateFinalizeEvent>(context, pipeline.get(), op, gstate);
	this->InsertEvent(std::move(new_event));
}